

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

int IDisk::CompareForSync(uchar *src,uchar *src2,int size)

{
  int i;
  long lVar1;
  ulong uVar2;
  
  if (1 < size) {
    lVar1 = 1;
    do {
      if (src[lVar1] != src2[lVar1]) {
        uVar2 = 1;
        do {
          if (src[uVar2] != src2[uVar2 - 1]) {
            if (1 < uVar2) {
              return -1;
            }
            if (src2[uVar2] == '\x01') {
              return -1;
            }
          }
          uVar2 = uVar2 + 2;
          if (size <= (int)uVar2) {
            return 1;
          }
        } while( true );
      }
      lVar1 = lVar1 + 2;
    } while ((int)lVar1 < size);
  }
  return 0;
}

Assistant:

int IDisk::CompareForSync(unsigned char* src, unsigned char* src2, int size)
{
   int found = 0;

   // Src is from unsafe source : It can be :
   // - Shiffted
   // - incomplete (only one bit every 2 MFM bit is stored - It can be data or clock bit)
   for (int i = 1; i < size; i += 2)
   {
      // Add this : 10 == 00
      // Only check data bit (no clock bit)
      if (src[i] != src2[i])
      {
         found = -1;
         break;
      }
   }

   if (found == 0)
      return found;

   found = 1;
   for (int i = 1; i < size; i += 2)
   {
      // Now, check clock bit (maybe it's the one that is stored)
      if ((src[i] != src2[i - 1]) && (i > 1 || src2[i] == 1))
      {
         found = -1;
         break;
      }
   }
   return found;
}